

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

ostream * __thiscall
pstack::Procman::Process::dumpFrameText(Process *this,ostream *os,StackFrame *frame,int frameNo)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  DIE *pDVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__s;
  StackFrame *die;
  undefined8 uVar12;
  ostream *poVar13;
  sptr sVar14;
  undefined1 local_2d8 [8];
  IOFlagSave _;
  PrintableFrame pframe;
  undefined1 local_168 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  long local_140;
  long *local_138;
  undefined1 local_130 [8];
  ProcessLocation location;
  undefined1 auStack_f8 [8];
  MaybeNamedSymbol sym;
  undefined1 local_b0 [8];
  string name;
  undefined1 auStack_88 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> src;
  undefined1 local_58 [8];
  string flags;
  
  src._36_4_ = frameNo;
  IOFlagSave::IOFlagSave((IOFlagSave *)local_2d8,(ios *)(os + *(long *)(*(long *)os + -0x18)));
  PrintableFrame::PrintableFrame((PrintableFrame *)&_.field_0x108,this,frame);
  StackFrame::scopeIP((ProcessLocation *)local_130,frame,this);
  location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)frame;
  if (this->context[0x88] != (Context)0x1) {
    ProcessLocation::source_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)auStack_88,(ProcessLocation *)local_130);
    _Var3 = src.first._M_dataplus;
    auStack_f8 = (undefined1  [8])
                 location.codeloc.
                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
    sym.
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._0_8_ = 0;
    sym.
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.first.st_value = 0;
    auStack_88 = (undefined1  [8])0x0;
    src.first._M_dataplus._M_p = (pointer)0x0;
    src.first._M_string_length = 0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_f8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_88);
    _Var2 = location.codeloc.
            super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p !=
        location.codeloc.
        super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi) {
      auStack_88 = (undefined1  [8])&src.first._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_88,
                 (location.codeloc.
                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base,
                 *(long *)&(location.codeloc.
                            super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count +
                 (long)(location.codeloc.
                        super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base);
      src.first.field_2._8_4_ = *(undefined4 *)&_Var2._M_pi[2]._vptr__Sp_counted_base;
      goto LAB_0012701d;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"",(allocator<char> *)auStack_f8);
  src.first.field_2._8_4_ = 0xffffffff;
LAB_0012701d:
  die = (StackFrame *)
        pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
        _M_impl.super__Vector_impl_data._M_start;
  flags.field_2._8_8_ = this;
  if (this->context[0x8c] == (Context)0x0) {
    while (die != pframe.frame) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
      lVar9 = *(long *)os;
      *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      *(undefined8 *)(os + *(long *)(lVar9 + -0x18) + 0x10) = 2;
      poVar5 = os + *(long *)(lVar9 + -0x18);
      if (os[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar5);
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x20;
      poVar5 = (ostream *)std::ostream::operator<<(os,src._36_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar9 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 0x12;
      lVar9 = *(long *)(lVar9 + -0x18);
      poVar13 = poVar5 + lVar9;
      if (poVar5[lVar9 + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar13);
        poVar13[0xe1] = (ostream)0x1;
      }
      poVar13[0xe0] = (ostream)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inlined",7);
      std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
      die = (StackFrame *)&die[-1].regs.es;
      buildDIEName(os,(DIE *)die,true);
      if ((*(char *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0x88) == '\0') &&
         (plVar6 = (long *)pstack::Dwarf::Unit::getLines(), *plVar6 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," at ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)auStack_88,(long)src.first._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        std::ostream::operator<<(poVar5,src.first.field_2._8_4_);
        lVar9 = *plVar6;
        pstack::Dwarf::DIE::attribute((AttrName)(DIE *)auStack_f8,SUB81(die,0));
        lVar7 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)auStack_f8);
        local_140 = *(long *)(lVar9 + 0x38);
        plVar1 = (long *)(local_140 + lVar7 * 0x30);
        Dwarf::DIE::~DIE((DIE *)auStack_f8);
        if (*(int *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0xa0) == 0) {
          local_58 = (undefined1  [8])&flags._M_string_length;
          std::__cxx11::string::_M_construct<char*>((string *)local_58,*plVar1,plVar1[1] + *plVar1);
        }
        else {
          lVar7 = (ulong)*(uint *)(local_140 + (lVar7 * 3 + 2) * 0x10) * 0x20;
          auStack_f8 = (undefined1  [8])
                       ((long)&sym.
                               super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_payload + 8);
          lVar9 = *(long *)(*(long *)(*plVar6 + 0x20) + lVar7);
          local_138 = plVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)auStack_f8,lVar9,
                     *(long *)(*(long *)(*plVar6 + 0x20) + 8 + lVar7) + lVar9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_f8
                     ,"/");
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_f8,(char *)*local_138,local_138[1]);
          local_58 = (undefined1  [8])(pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if (local_58 == (undefined1  [8])paVar11) {
            flags._M_string_length = paVar11->_M_allocated_capacity;
            flags.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar8->field_2 + 8);
            local_58 = (undefined1  [8])&flags._M_string_length;
          }
          else {
            flags._M_string_length = paVar11->_M_allocated_capacity;
          }
          flags._M_dataplus._M_p = (pointer)pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          if (auStack_f8 !=
              (undefined1  [8])
              ((long)&sym.
                      super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_payload + 8)) {
            operator_delete((void *)auStack_f8,
                            sym.
                            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_payload._M_value.first.st_value + 1);
          }
        }
        pstack::Dwarf::DIE::attribute((AttrName)(Attribute *)auStack_f8,SUB81(die,0));
        lVar9 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)auStack_f8);
        local_b0 = (undefined1  [8])&name._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,local_58,flags._M_dataplus._M_p + (long)local_58);
        name.field_2._8_8_ = lVar9;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
        src.first.field_2._8_4_ = name.field_2._8_4_;
        if (local_b0 != (undefined1  [8])&name._M_string_length) {
          operator_delete((void *)local_b0,
                          CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) +
                          1);
        }
        Dwarf::DIE::~DIE((DIE *)auStack_f8);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (local_58 != (undefined1  [8])&flags._M_string_length) {
          operator_delete((void *)local_58,flags._M_string_length + 1);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
  uVar12 = flags.field_2._8_8_;
  _Var2._M_pi = local_148._M_pi;
  lVar9 = *(long *)os;
  *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(os + *(long *)(lVar9 + -0x18) + 0x10) = 2;
  poVar5 = os + *(long *)(lVar9 + -0x18);
  if (os[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar5);
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  poVar5 = (ostream *)std::ostream::operator<<(os,src._36_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
  lVar9 = *(long *)poVar5;
  *(uint *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 0x10;
  poVar13 = poVar5 + *(long *)(lVar9 + -0x18);
  if (poVar5[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar13);
    poVar13[0xe1] = (ostream)0x1;
  }
  poVar13[0xe0] = (ostream)0x30;
  StackFrame::rawIP((StackFrame *)_Var2._M_pi);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if (location.location_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," no information for frame",0x19);
  }
  else {
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length._0_1_ = 0;
    local_b0 = (undefined1  [8])&name._M_string_length;
    local_58 = (undefined1  [8])&flags._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    if (*(bool *)((long)&_Var2._M_pi[0xe]._vptr__Sp_counted_base + 4) == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,"*");
    }
    ProcessLocation::symbol_abi_cxx11_((MaybeNamedSymbol *)auStack_f8,(ProcessLocation *)local_130);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe,
                       "");
    if (iVar4 == 0) {
      if (sym.
          super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_payload._48_1_ == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sym.
                           super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_payload._M_value.first + 0x10));
        if (location.location_ == 0) {
          pDVar10 = (DIE *)&Dwarf::DIE::null;
        }
        else {
          pDVar10 = CodeLocation::die((CodeLocation *)location.location_);
        }
        __s = "%";
        if ((pDVar10->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          __s = "!";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,__s
                  );
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,0,
                   (size_type)name._M_dataplus._M_p,"<unknown>",9);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(char *)local_b0,(long)name._M_dataplus._M_p);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_58,(long)flags._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)flags.field_2._8_8_;
    Procman::operator<<(poVar5,(ArgPrint *)
                               &pframe.inlined.
                                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    if (pframe.dieName.field_2._8_8_ != -1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"+",1);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
    sVar14 = ProcessLocation::elf((ProcessLocation *)(local_168 + 0x10));
    stringify<pstack::Reader_const&>
              ((string *)
               &pframe.inlined.
                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (pstack *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168._16_8_ + 0x40))->
               _vptr__Sp_counted_base,
               (Reader *)
               sVar14.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)pframe.inlined.
                          super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_Var2._M_pi);
    if (pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_168) {
      operator_delete(pframe.inlined.
                      super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_168._0_8_ + 1);
    }
    if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
    }
    if (*(int *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0xa0) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"@0x",3);
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
      StackFrame::rawIP((StackFrame *)_Var2._M_pi);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_88,"");
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os," at ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)auStack_88,(long)src.first._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::operator<<(poVar5,src.first.field_2._8_4_);
    }
    if ((sym.
         super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_payload._48_1_ == '\x01') &&
       (sym.
        super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_payload._48_1_ = 0,
       (undefined1 *)
       sym.
       super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_payload._M_value.first.st_size !=
       (undefined1 *)
       ((long)&sym.
               super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload + 0x20))) {
      operator_delete((void *)sym.
                              super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_payload._M_value.first.st_size,
                      sym.
                      super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_payload._M_value.second._M_string_length + 1);
    }
    if (local_58 != (undefined1  [8])&flags._M_string_length) {
      operator_delete((void *)local_58,flags._M_string_length + 1);
    }
    uVar12 = flags.field_2._8_8_;
    if (local_b0 != (undefined1  [8])&name._M_string_length) {
      operator_delete((void *)local_b0,
                      CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) + 1);
    }
  }
  if (*(int *)(*(long *)(uVar12 + 0xa0) + 0xa0) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," via ",5);
    Procman::operator<<(os,*(UnwindMechanism *)&_Var2._M_pi[0xe]._vptr__Sp_counted_base);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (auStack_88 != (undefined1  [8])&src.first._M_string_length) {
    operator_delete((void *)auStack_88,src.first._M_string_length + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)&location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  if (location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               location.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>::~vector
            ((vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_> *)&pframe.frame);
  if (pframe.proc != (Process *)&pframe.dieName._M_string_length) {
    operator_delete(pframe.proc,pframe.dieName._M_string_length + 1);
  }
  IOFlagSave::~IOFlagSave((IOFlagSave *)local_2d8);
  return os;
}

Assistant:

std::ostream &
Process::dumpFrameText(std::ostream &os, const StackFrame &frame, int frameNo)
{
    IOFlagSave _(os);
    PrintableFrame pframe(*this, frame);

    ProcessLocation location = frame.scopeIP(*this);
    std::vector<std::pair<std::string, int>> source;

    if (!context.options.nosrc)
        source = location.source();

    std::pair<std::string, int> src = source.size()
        ? source[0]
        : std::make_pair( "", std::numeric_limits<Elf::Addr>::max());

    if (!context.options.nodienames) {
        // inlining comes from DIEs with DW_TAG_inlined_subroutine - so no
        // point in trying this without DIE names
        for (auto i = pframe.inlined.rbegin(); i != pframe.inlined.rend(); ++i) {
           os << "#"
               << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
               << std::setw(ELF_BITS/4 + 2) << std::setfill(' ')
               << "inlined";
           os << " in ";
           buildDIEName(os, *i);
           if (!context.options.nosrc) {
               const auto &lineinfo = i->getUnit()->getLines();
               if (lineinfo) {
                  os << " at " << src.first << ":" << src.second;
                  auto &fileEnt = lineinfo->files[intmax_t(i->attribute(Dwarf::DW_AT_call_file))];
                  auto &dirname = lineinfo->directories[fileEnt.dirindex];
                  const auto &name = context.verbose ? dirname + "/" + fileEnt.name : fileEnt.name;
                  src = std::make_pair( name, intmax_t(i->attribute(Dwarf::DW_AT_call_line)));
                  os << "\n";
               }
           }
        }
    }

    os << "#"
        << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
        << std::right << "0x" << std::hex << std::setw(ELF_BITS/4) << std::setfill('0')
        << frame.rawIP() << std::dec;

    if (location.inObject()) {
        std::string name;
        std::string flags = "";
        if (frame.isSignalTrampoline)
            flags += "*";

        auto sym = location.symbol();
        if (pframe.dieName != "") {
            name = pframe.dieName;
        } else if (sym) {
            name = sym->second;
            flags += location.die() ? "%" : "!";
        } else {
            name = "<unknown>";
        }
        os << " in "
            << name
            << flags
            << "(" << ArgPrint(*this, frame) << ")";

        if (pframe.functionOffset != std::numeric_limits<Elf::Addr>::max())
            os << "+" << pframe.functionOffset;
        os << " in " << stringify(*location.elf()->io);
        if (context.verbose)
           os << "@0x" << std::hex << frame.rawIP() - location.elfReloc() << std::dec;
        if (src.first != "")
           os << " at " << src.first << ":" << std::dec << src.second;
    } else {
        os << " no information for frame";
    }
    if (context.verbose)
       os << " via " << frame.mechanism;
    os << "\n";
    return os;
}